

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * step_abi_cxx11_(string *__return_storage_ptr__,field_t *f,pos_t *s,bool *back,bool *explore
                        )

{
  allocator<std::vector<int,_std::allocator<int>_>_> *this;
  int iVar1;
  size_type __n;
  size_type __n_00;
  reference pvVar2;
  reference pvVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  ostream *poVar6;
  int iVar7;
  byte local_145;
  allocator<char> local_eb;
  allocator<char> local_ea;
  allocator<char> local_e9;
  undefined4 local_e8;
  allocator<char> local_e2;
  char local_e1;
  int local_e0;
  int iStack_dc;
  bool last_step;
  int x_1;
  int y_1;
  pair<int,_int> local_d0;
  pair<int,_int> local_c8;
  int local_c0;
  int local_bc;
  int x;
  int y;
  way_t wc;
  pair<int,_int> local_98;
  pos_t c;
  pair<int,_int> local_88;
  pos_t e;
  allocator<int> local_6d;
  value_type_conflict local_6c;
  vector<int,_std::allocator<int>_> local_68;
  undefined1 local_50 [8];
  way_t ways;
  bool found_way;
  bool step_taken;
  bool *explore_local;
  bool *back_local;
  pos_t *s_local;
  field_t *f_local;
  
  ways.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  __n = (size_type)R;
  __n_00 = (size_type)C;
  local_6c = 0;
  std::allocator<int>::allocator(&local_6d);
  std::vector<int,_std::allocator<int>_>::vector(&local_68,__n_00,&local_6c,&local_6d);
  this = (allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&e.first + 3);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(this);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_50,__n,&local_68,this);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&e.first + 3));
  std::vector<int,_std::allocator<int>_>::~vector(&local_68);
  std::allocator<int>::~allocator(&local_6d);
  pvVar2 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)local_50,(long)s->first);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)s->second);
  *pvVar3 = 1;
  c.second = -1;
  c.first = -1;
  std::pair<int,_int>::pair<int,_int,_true>(&local_88,&c.second,&c.first);
  wc.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0xffffffff;
  wc.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0xffffffff;
  std::pair<int,_int>::pair<int,_int,_true>
            (&local_98,
             (int *)((long)&wc.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
             (int *)&wc.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  do {
    ways.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)&x,(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)local_50);
    for (local_bc = 0; local_bc < R; local_bc = local_bc + 1) {
      for (local_c0 = 0; local_c0 < C; local_c0 = local_c0 + 1) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_50,(long)local_bc);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_c0);
        if (*pvVar3 == 0) {
          pvVar4 = std::
                   vector<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
                   ::operator[](f,(long)local_bc);
          pvVar5 = std::vector<ECell,_std::allocator<ECell>_>::operator[](pvVar4,(long)local_c0);
          if (*pvVar5 != EC_HOLLOW) {
            pvVar4 = std::
                     vector<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
                     ::operator[](f,(long)local_bc);
            pvVar5 = std::vector<ECell,_std::allocator<ECell>_>::operator[](pvVar4,(long)local_c0);
            if (*pvVar5 != EC_CONTROL) {
              pvVar4 = std::
                       vector<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
                       ::operator[](f,(long)local_bc);
              pvVar5 = std::vector<ECell,_std::allocator<ECell>_>::operator[](pvVar4,(long)local_c0)
              ;
              if (*pvVar5 != EC_START) {
                pvVar4 = std::
                         vector<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
                         ::operator[](f,(long)local_bc);
                pvVar5 = std::vector<ECell,_std::allocator<ECell>_>::operator[]
                                   (pvVar4,(long)local_c0);
                if (*pvVar5 != EC_UNKNOWN) goto LAB_00109a49;
              }
            }
          }
          if (0 < local_bc) {
            pvVar2 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)local_50,(long)(local_bc + -1));
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_c0);
            if (0 < *pvVar3) {
              pvVar2 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)&x,(long)local_bc);
              pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_c0);
              *pvVar3 = 1;
              ways.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
            }
          }
          if (local_bc + 1 < R) {
            pvVar2 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)local_50,(long)(local_bc + 1));
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_c0);
            if (0 < *pvVar3) {
              pvVar2 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)&x,(long)local_bc);
              pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_c0);
              *pvVar3 = 1;
              ways.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
            }
          }
          if (0 < local_c0) {
            pvVar2 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)local_50,(long)local_bc);
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                               (pvVar2,(long)(local_c0 + -1));
            if (0 < *pvVar3) {
              pvVar2 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)&x,(long)local_bc);
              pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_c0);
              *pvVar3 = 1;
              ways.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
            }
          }
          if (local_c0 + 1 < C) {
            pvVar2 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)local_50,(long)local_bc);
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)(local_c0 + 1))
            ;
            if (0 < *pvVar3) {
              pvVar2 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)&x,(long)local_bc);
              pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_c0);
              *pvVar3 = 1;
              ways.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
            }
          }
          pvVar2 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)&x,(long)local_bc);
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_c0);
          if (*pvVar3 == 1) {
            if ((*back & 1U) == 0) {
              pvVar4 = std::
                       vector<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
                       ::operator[](f,(long)local_bc);
              pvVar5 = std::vector<ECell,_std::allocator<ECell>_>::operator[](pvVar4,(long)local_c0)
              ;
              if (*pvVar5 == EC_CONTROL) {
                std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_d0,&local_bc,&local_c0);
                std::pair<int,_int>::operator=(&local_98,&local_d0);
              }
              if ((*explore & 1U) != 0) {
                pvVar4 = std::
                         vector<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
                         ::operator[](f,(long)local_bc);
                pvVar5 = std::vector<ECell,_std::allocator<ECell>_>::operator[]
                                   (pvVar4,(long)local_c0);
                if (*pvVar5 == EC_UNKNOWN) {
                  ways.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
                  std::pair<int,_int>::pair<int_&,_int_&,_true>
                            ((pair<int,_int> *)&x_1,&local_bc,&local_c0);
                  std::pair<int,_int>::operator=(&local_88,(type)&x_1);
                  poVar6 = std::operator<<((ostream *)&std::cerr,"move to ");
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_bc);
                  poVar6 = std::operator<<(poVar6,", ");
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_c0);
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                }
              }
            }
            else {
              pvVar4 = std::
                       vector<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
                       ::operator[](f,(long)local_bc);
              pvVar5 = std::vector<ECell,_std::allocator<ECell>_>::operator[](pvVar4,(long)local_c0)
              ;
              if (*pvVar5 == EC_START) {
                ways.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
                std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_c8,&local_bc,&local_c0);
                std::pair<int,_int>::operator=(&local_88,&local_c8);
              }
            }
          }
        }
        else {
LAB_00109a49:
          pvVar2 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)local_50,(long)local_bc);
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_c0);
          if (0 < *pvVar3) {
            pvVar2 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)local_50,(long)local_bc);
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_c0);
            iVar7 = *pvVar3;
            pvVar2 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)&x,(long)local_bc);
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_c0);
            *pvVar3 = iVar7 + 1;
          }
        }
      }
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator=((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_50,
                (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&x);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&x);
    local_145 = 0;
    if ((ways.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      local_145 = ways.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ ^ 0xff;
    }
  } while ((local_145 & 1) != 0);
  if (((ways.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) &&
     ((*explore & 1U) != 0)) {
    *explore = false;
  }
  if (((*explore & 1U) == 0) && ((*back & 1U) == 0)) {
    std::pair<int,_int>::operator=(&local_88,&local_98);
  }
  for (iStack_dc = 0; iStack_dc < R; iStack_dc = iStack_dc + 1) {
    for (local_e0 = 0; local_e0 < C; local_e0 = local_e0 + 1) {
      std::ios_base::width((ios_base *)((long)&std::cerr + *(long *)(std::cerr + -0x18)),3);
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_50,(long)iStack_dc);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_e0);
      std::ostream::operator<<((ostream *)&std::cerr,*pvVar3);
    }
    std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
  }
  if (local_88.first == -1) {
    __assert_fail("-1 != e.first",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/hard/the.labyrinth/main.cpp"
                  ,0x7e,"std::string step(const field_t &, const pos_t &, bool &, bool &)");
  }
  local_e1 = '\x01';
  do {
    iVar7 = local_88.first - s->first;
    if (iVar7 < 1) {
      iVar7 = -iVar7;
    }
    iVar1 = local_88.second - s->second;
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    if (iVar7 + iVar1 < 2) {
      if (local_e1 != '\0') {
        *back = true;
      }
      if (local_88.first < s->first) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"UP",&local_e2);
        std::allocator<char>::~allocator(&local_e2);
      }
      else if (s->first < local_88.first) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"DOWN",&local_e9);
        std::allocator<char>::~allocator(&local_e9);
      }
      else if (local_88.second < s->second) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"LEFT",&local_ea);
        std::allocator<char>::~allocator(&local_ea);
      }
      else {
        if (local_88.second <= s->second) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/hard/the.labyrinth/main.cpp"
                        ,0xad,"std::string step(const field_t &, const pos_t &, bool &, bool &)");
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"RIGHT",&local_eb);
        std::allocator<char>::~allocator(&local_eb);
      }
      local_e8 = 1;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_50);
      return __return_storage_ptr__;
    }
    if (local_88.first < 1) {
LAB_00109cf5:
      if (local_88.first + 1 < R) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_50,(long)local_88.first);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_88.second);
        iVar7 = *pvVar3;
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_50,(long)(local_88.first + 1));
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_88.second);
        if (iVar7 < *pvVar3) {
          local_88.first = local_88.first + 1;
          goto LAB_00109e4c;
        }
      }
      if (0 < local_88.second) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_50,(long)local_88.first);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_88.second);
        iVar7 = *pvVar3;
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_50,(long)local_88.first);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           (pvVar2,(long)(local_88.second + -1));
        if (iVar7 < *pvVar3) {
          local_88.second = local_88.second + -1;
          goto LAB_00109e4c;
        }
      }
      if (C <= local_88.second + 1) {
LAB_00109e27:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/hard/the.labyrinth/main.cpp"
                      ,0x96,"std::string step(const field_t &, const pos_t &, bool &, bool &)");
      }
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_50,(long)local_88.first);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_88.second);
      iVar7 = *pvVar3;
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_50,(long)local_88.first);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (pvVar2,(long)(local_88.second + 1));
      if (*pvVar3 <= iVar7) goto LAB_00109e27;
      local_88.second = local_88.second + 1;
    }
    else {
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_50,(long)local_88.first);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_88.second);
      iVar7 = *pvVar3;
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_50,(long)(local_88.first + -1));
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_88.second);
      if (*pvVar3 <= iVar7) goto LAB_00109cf5;
      local_88.first = local_88.first + -1;
    }
LAB_00109e4c:
    local_e1 = '\0';
  } while( true );
}

Assistant:

std::string step(const field_t& f, const pos_t& s, bool& back, bool& explore)
{
    bool step_taken;
    bool found_way = false;
    way_t ways(R, wrow_t(C, 0));
    ways[s.first][s.second] = 1;
    pos_t e(-1, -1);
    pos_t c(-1, -1);
    do
    {
        step_taken = false;
        way_t wc = ways; 
        for (int y = 0; y < R; y++)
        {
            for (int x = 0; x < C; x++)
            {
                if (0 == ways[y][x]
                    && (EC_HOLLOW == f[y][x]
                        || EC_CONTROL == f[y][x]
                        || EC_START == f[y][x]
                        || EC_UNKNOWN == f[y][x]))
                {
                    if (0 < y && 0 < ways[y - 1][x])
                    {
                        wc[y][x] = 1;
                        step_taken = true;
                    }
                    if (R > y + 1 && 0 < ways[y + 1][x])
                    {
                        wc[y][x] = 1;
                        step_taken = true;
                    }
                    if (0 < x && 0 < ways[y][x - 1])
                    {
                        wc[y][x] = 1;
                        step_taken = true;
                    }
                    if (C > x + 1 && 0 < ways[y][x + 1])
                    {
                        wc[y][x] = 1;
                        step_taken = true;
                    }
                    if (1 == wc[y][x])
                    {
                        if (back)
                        {
                            if (EC_START == f[y][x])
                            {
                                found_way = true;
                                e = pos_t(y, x);
                            }
                        }
                        else
                        {
                            if (EC_CONTROL == f[y][x])
                            {
                                c = pos_t(y, x);
                            }
                            if (explore && EC_UNKNOWN == f[y][x])
                            {
                                found_way = true;
                                e = pos_t(y, x);
                                std::cerr << "move to " << y << ", " << x << std::endl;
                            }
                        }
                    }
                } else if (0 < ways[y][x])
                {
                    wc[y][x] = 1 + ways[y][x];
                }
            }
        }
        ways = wc;
    } while (step_taken && !found_way);
    
    if (!found_way && explore)
    {
        explore = false;
    }
    
    if (!explore && !back)
    {
        e = c;
    }
    
    for (int y = 0; y < R; y++)
    {
        for (int x = 0; x < C; x++)
        {
            std::cerr.width(3);
            std::cerr << ways[y][x];
        }
        std::cerr << std::endl;
    }

    assert(-1 != e.first);
    
    bool last_step = true;
    while (1 < abs(e.first - s.first) + abs(e.second - s.second))
    {
        //std::cerr << e.first << ", " << e.second << std::endl;
        if (0 < e.first && ways[e.first][e.second] < ways[e.first - 1][e.second])
        {
            e.first--;
        }
        else if (R > e.first + 1 && ways[e.first][e.second] < ways[e.first + 1][e.second])
        {
            e.first++;
        }
        else if (0 < e.second && ways[e.first][e.second] < ways[e.first][e.second - 1])
        {
            e.second--;
        }
        else if (C > e.second + 1 && ways[e.first][e.second] < ways[e.first][e.second + 1])
        {
            e.second++;
        }
        else
        {
            assert(false);
        }
        last_step = false;
    }
    
    if (last_step)
    {
        back = true;
    }
    if (e.first < s.first)
    {
        return "UP";
    } else if (e.first > s.first)
    {
        return "DOWN";
    } else if (e.second < s.second)
    {
        return "LEFT";
    } else if (e.second > s.second)
    {
        return "RIGHT";
    }
    
    assert(false);
}